

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaCommand.cxx
# Opt level: O0

bool __thiscall MetaCommand::OptionExistsByMinusTag(MetaCommand *this,string *minusTag)

{
  bool bVar1;
  __type _Var2;
  reference pOVar3;
  string tagToSearch;
  const_iterator it;
  vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_> *in_stack_ffffffffffffff78;
  allocator *in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff98;
  uint uVar4;
  undefined4 in_stack_ffffffffffffff9c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa0;
  allocator local_51;
  string local_50 [32];
  Option *local_30;
  Option *local_28;
  __normal_iterator<const_MetaCommand::Option_*,_std::vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>_>
  local_20 [3];
  byte local_1;
  
  local_28 = (Option *)
             std::vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>::begin
                       (in_stack_ffffffffffffff78);
  __gnu_cxx::
  __normal_iterator<MetaCommand::Option_const*,std::vector<MetaCommand::Option,std::allocator<MetaCommand::Option>>>
  ::__normal_iterator<MetaCommand::Option*>
            ((__normal_iterator<const_MetaCommand::Option_*,_std::vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>_>
              *)in_stack_ffffffffffffff80,
             (__normal_iterator<MetaCommand::Option_*,_std::vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>_>
              *)in_stack_ffffffffffffff78);
  while( true ) {
    local_30 = (Option *)
               std::vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>::end
                         (in_stack_ffffffffffffff78);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_MetaCommand::Option_*,_std::vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>_>
                        *)in_stack_ffffffffffffff80,
                       (__normal_iterator<MetaCommand::Option_*,_std::vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>_>
                        *)in_stack_ffffffffffffff78);
    if (!bVar1) break;
    in_stack_ffffffffffffff80 = &local_51;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_50,"-",in_stack_ffffffffffffff80);
    std::allocator<char>::~allocator((allocator<char> *)&local_51);
    pOVar3 = __gnu_cxx::
             __normal_iterator<const_MetaCommand::Option_*,_std::vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>_>
             ::operator*(local_20);
    std::__cxx11::string::operator+=(local_50,(string *)&pOVar3->tag);
    _Var2 = std::operator==(in_stack_ffffffffffffffa0,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
    if (_Var2) {
      local_1 = 1;
    }
    else {
      __gnu_cxx::
      __normal_iterator<const_MetaCommand::Option_*,_std::vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>_>
      ::operator++(local_20);
    }
    uVar4 = (uint)_Var2;
    std::__cxx11::string::~string(local_50);
    if (uVar4 != 0) goto LAB_0012969c;
    in_stack_ffffffffffffff98 = 0;
  }
  local_1 = 0;
LAB_0012969c:
  return (bool)(local_1 & 1);
}

Assistant:

bool
MetaCommand::OptionExistsByMinusTag(METAIO_STL::string minusTag)
{
  OptionVector::const_iterator it = m_OptionVector.begin();
  while(it != m_OptionVector.end())
    {
    METAIO_STL::string tagToSearch = "-";
    tagToSearch += (*it).tag;
    if(tagToSearch == minusTag)
      {
      return true;
      }
    ++it;
    }

  return false;

}